

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::SetupNodeMetadata(FBXConverter *this,Model *model,aiNode *nd)

{
  PropertyTable *this_00;
  undefined8 uVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  aiMetadata *paVar4;
  aiString *paVar5;
  aiMetadataEntry *paVar6;
  Property *pPVar7;
  long lVar8;
  long *plVar9;
  undefined4 *puVar10;
  void *pvVar11;
  long lVar12;
  undefined8 *puVar13;
  _Base_ptr p_Var14;
  uint uVar15;
  aiString *paVar16;
  string *psVar17;
  size_t sVar18;
  size_t __n;
  undefined1 *puVar19;
  ulong uVar20;
  DirectPropertyMap unparsedProperties;
  long local_4f0;
  undefined1 *local_4e8;
  ulong local_4e0;
  undefined1 local_4d8 [16];
  undefined1 *local_4c8;
  ulong local_4c0;
  undefined1 local_4b8 [16];
  string local_4a8;
  undefined1 *local_488;
  long local_480;
  undefined1 local_478 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  local_468;
  undefined8 local_438;
  ulong local_430;
  undefined1 local_428 [1016];
  
  this_00 = (model->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXDocument.h"
                  ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
  }
  PropertyTable::GetUnparsedProperties_abi_cxx11_((DirectPropertyMap *)&local_468,this_00);
  uVar15 = (int)local_468._M_impl.super__Rb_tree_header._M_node_count + 2;
  if (uVar15 == 0) {
    paVar4 = (aiMetadata *)0x0;
  }
  else {
    paVar4 = (aiMetadata *)operator_new(0x18);
    paVar4->mNumProperties = uVar15;
    uVar20 = (ulong)uVar15;
    paVar5 = (aiString *)operator_new__(uVar20 * 0x404);
    paVar16 = paVar5;
    do {
      paVar16->length = 0;
      paVar16->data[0] = '\0';
      memset(paVar16->data + 1,0x1b,0x3ff);
      paVar16 = paVar16 + 1;
    } while (paVar16 != paVar5 + uVar20);
    paVar4->mKeys = paVar5;
    paVar6 = (aiMetadataEntry *)operator_new__(uVar20 << 4);
    memset(paVar6,0,uVar20 << 4);
    paVar4->mValues = paVar6;
  }
  nd->mMetaData = paVar4;
  local_4c8 = local_4b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4c8,"UserProperties","");
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"UDP3DSMAX","");
  psVar17 = (string *)&local_488;
  local_488 = local_478;
  std::__cxx11::string::_M_construct<char_const*>(psVar17,"");
  pPVar7 = PropertyTable::Get(this_00,&local_4a8);
  if ((pPVar7 == (Property *)0x0) ||
     (lVar8 = __dynamic_cast(pPVar7,&Property::typeinfo,
                             &TypedProperty<std::__cxx11::string>::typeinfo,0), lVar8 == 0)) {
    plVar9 = &local_480;
  }
  else {
    psVar17 = (string *)(lVar8 + 8);
    plVar9 = (long *)(lVar8 + 0x10);
  }
  local_4e8 = local_4d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4e8,*(long *)psVar17,*plVar9 + *(long *)psVar17);
  puVar19 = local_4e8;
  sVar18 = 0x3ff;
  if ((local_4e0 & 0xfffffc00) == 0) {
    sVar18 = local_4e0 & 0xffffffff;
  }
  local_438 = (undefined1 *)CONCAT44(local_438._4_4_,(uint)sVar18);
  memcpy((void *)((long)&local_438 + 4),local_4e8,sVar18);
  *(undefined1 *)((long)&local_438 + sVar18 + 4) = 0;
  if ((paVar4->mNumProperties != 0) && (local_4c0 != 0)) {
    if (local_4c0 < 0x400) {
      paVar16 = paVar4->mKeys;
      paVar16->length = (ai_uint32)local_4c0;
      memcpy(paVar16->data,local_4c8,local_4c0);
      paVar16->data[local_4c0] = '\0';
    }
    paVar4->mValues->mType = AI_AISTRING;
    puVar10 = (undefined4 *)operator_new(0x404);
    __n = 0x3ff;
    if ((uint)sVar18 < 0x3ff) {
      __n = sVar18;
    }
    *puVar10 = (int)__n;
    memcpy(puVar10 + 1,(void *)((long)&local_438 + 4),__n);
    *(undefined1 *)((long)puVar10 + __n + 4) = 0;
    paVar4->mValues->mData = puVar10;
    puVar19 = local_4e8;
  }
  if (puVar19 != local_4d8) {
    operator_delete(puVar19);
  }
  if (local_488 != local_478) {
    operator_delete(local_488);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  if (local_4c8 != local_4b8) {
    operator_delete(local_4c8);
  }
  local_438 = local_428;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"IsNull","");
  bVar3 = Model::IsNull(model);
  if ((1 < paVar4->mNumProperties) && (local_430 != 0)) {
    if (local_430 < 0x400) {
      paVar16 = paVar4->mKeys;
      paVar16[1].length = (ai_uint32)local_430;
      memcpy(paVar16[1].data,local_438,local_430);
      paVar16[1].data[local_430] = '\0';
    }
    paVar4->mValues[1].mType = AI_BOOL;
    pvVar11 = operator_new(1);
    *(bool *)pvVar11 = bVar3;
    paVar4->mValues[1].mData = pvVar11;
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if ((_Rb_tree_header *)local_468._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_468._M_impl.super__Rb_tree_header) {
    uVar20 = 2;
    local_4f0 = 0;
    lVar8 = 0;
    p_Var14 = local_468._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      uVar1 = *(undefined8 *)(p_Var14 + 2);
      lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<bool>::typeinfo,0);
      if (lVar12 == 0) {
        lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<int>::typeinfo,0);
        if (lVar12 == 0) {
          lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<unsigned_long>::typeinfo,
                                  0);
          if (lVar12 == 0) {
            lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,&TypedProperty<float>::typeinfo,0);
            if (lVar12 == 0) {
              lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,
                                      &TypedProperty<std::__cxx11::string>::typeinfo,0);
              if (lVar12 == 0) {
                lVar12 = __dynamic_cast(uVar1,&Property::typeinfo,
                                        &TypedProperty<aiVector3t<float>>::typeinfo,0);
                if (lVar12 == 0) {
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                                ,0x387,
                                "void Assimp::FBX::FBXConverter::SetupNodeMetadata(const Model &, aiNode &)"
                               );
                }
                if ((uVar20 < paVar4->mNumProperties) &&
                   (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
                  if (p_Var2 < (_Base_ptr)0x400) {
                    paVar16 = paVar4->mKeys;
                    *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
                    memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
                    *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
                  }
                  *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 6;
                  puVar13 = (undefined8 *)operator_new(0xc);
                  *(undefined4 *)(puVar13 + 1) = *(undefined4 *)(lVar12 + 0x10);
                  *puVar13 = *(undefined8 *)(lVar12 + 8);
                  paVar6 = paVar4->mValues;
                  goto LAB_0016f417;
                }
              }
              else {
                sVar18 = *(ulong *)(lVar12 + 0x10) & 0xffffffff;
                if ((*(ulong *)(lVar12 + 0x10) & 0xfffffc00) != 0) {
                  sVar18 = 0x3ff;
                }
                memcpy((void *)((long)&local_438 + 4),*(void **)(lVar12 + 8),sVar18);
                *(undefined1 *)((long)&local_438 + sVar18 + 4) = 0;
                if ((uVar20 < paVar4->mNumProperties) &&
                   (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
                  if (p_Var2 < (_Base_ptr)0x400) {
                    paVar16 = paVar4->mKeys;
                    *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
                    memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
                    *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
                  }
                  *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 5;
                  puVar10 = (undefined4 *)operator_new(0x404);
                  if (0x3fe < (uint)sVar18) {
                    sVar18 = 0x3ff;
                  }
                  *puVar10 = (int)sVar18;
                  memcpy(puVar10 + 1,(void *)((long)&local_438 + 4),sVar18);
                  *(undefined1 *)((long)puVar10 + sVar18 + 4) = 0;
                  *(undefined4 **)((long)&paVar4->mValues[2].mData + local_4f0) = puVar10;
                }
              }
            }
            else if ((uVar20 < paVar4->mNumProperties) &&
                    (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
              if (p_Var2 < (_Base_ptr)0x400) {
                paVar16 = paVar4->mKeys;
                *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
                memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
                *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
              }
              *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 3;
              puVar13 = (undefined8 *)operator_new(4);
              *(undefined4 *)puVar13 = *(undefined4 *)(lVar12 + 8);
              goto LAB_0016f413;
            }
          }
          else if ((uVar20 < paVar4->mNumProperties) &&
                  (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
            if (p_Var2 < (_Base_ptr)0x400) {
              paVar16 = paVar4->mKeys;
              *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
              memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
              *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
            }
            *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 2;
            puVar13 = (undefined8 *)operator_new(8);
            *puVar13 = *(undefined8 *)(lVar12 + 8);
            goto LAB_0016f413;
          }
        }
        else if ((uVar20 < paVar4->mNumProperties) &&
                (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
          if (p_Var2 < (_Base_ptr)0x400) {
            paVar16 = paVar4->mKeys;
            *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
            memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
            *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
          }
          *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 1;
          puVar13 = (undefined8 *)operator_new(4);
          *(undefined4 *)puVar13 = *(undefined4 *)(lVar12 + 8);
          goto LAB_0016f413;
        }
      }
      else if ((uVar20 < paVar4->mNumProperties) &&
              (p_Var2 = p_Var14[1]._M_parent, p_Var2 != (_Base_ptr)0x0)) {
        if (p_Var2 < (_Base_ptr)0x400) {
          paVar16 = paVar4->mKeys;
          *(int *)(paVar16[2].data + lVar8 + -4) = (int)p_Var2;
          memcpy(paVar16[2].data + lVar8,*(void **)(p_Var14 + 1),(size_t)p_Var2);
          *(char *)((long)&p_Var2[0x40]._M_parent + (long)(paVar16->data + lVar8)) = '\0';
        }
        *(undefined4 *)((long)&paVar4->mValues[2].mType + local_4f0) = 0;
        puVar13 = (undefined8 *)operator_new(1);
        *(undefined1 *)puVar13 = *(undefined1 *)(lVar12 + 8);
LAB_0016f413:
        paVar6 = paVar4->mValues;
LAB_0016f417:
        *(undefined8 **)((long)&paVar6[2].mData + local_4f0) = puVar13;
      }
      uVar20 = uVar20 + 1;
      p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14);
      lVar8 = lVar8 + 0x404;
      local_4f0 = local_4f0 + 0x10;
    } while ((_Rb_tree_header *)p_Var14 != &local_468._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Assimp::FBX::Property>_>_>_>
  ::~_Rb_tree(&local_468);
  return;
}

Assistant:

void FBXConverter::SetupNodeMetadata(const Model& model, aiNode& nd)
        {
            const PropertyTable& props = model.Props();
            DirectPropertyMap unparsedProperties = props.GetUnparsedProperties();

            // create metadata on node
            const std::size_t numStaticMetaData = 2;
            aiMetadata* data = aiMetadata::Alloc(static_cast<unsigned int>(unparsedProperties.size() + numStaticMetaData));
            nd.mMetaData = data;
            int index = 0;

            // find user defined properties (3ds Max)
            data->Set(index++, "UserProperties", aiString(PropertyGet<std::string>(props, "UDP3DSMAX", "")));
            // preserve the info that a node was marked as Null node in the original file.
            data->Set(index++, "IsNull", model.IsNull() ? true : false);

            // add unparsed properties to the node's metadata
            for (const DirectPropertyMap::value_type& prop : unparsedProperties) {
                // Interpret the property as a concrete type
                if (const TypedProperty<bool>* interpreted = prop.second->As<TypedProperty<bool> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<int>* interpreted = prop.second->As<TypedProperty<int> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<uint64_t>* interpreted = prop.second->As<TypedProperty<uint64_t> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<float>* interpreted = prop.second->As<TypedProperty<float> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else if (const TypedProperty<std::string>* interpreted = prop.second->As<TypedProperty<std::string> >()) {
                    data->Set(index++, prop.first, aiString(interpreted->Value()));
                }
                else if (const TypedProperty<aiVector3D>* interpreted = prop.second->As<TypedProperty<aiVector3D> >()) {
                    data->Set(index++, prop.first, interpreted->Value());
                }
                else {
                    ai_assert(false);
                }
            }
        }